

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

int Gia_ManIsoStrashReduceOne(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int iLit;
  int iCi;
  int k;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x102b,
                  "int Gia_ManIsoStrashReduceOne(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_IntSize(vSupp);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    pNew_local._4_4_ = Abc_Var2Lit(0,iVar1);
  }
  else {
    iVar1 = Vec_IntSize(vSupp);
    if (iVar1 == 1) {
      iVar1 = Gia_ObjFaninC0(pObj);
      pNew_local._4_4_ = Abc_Var2Lit(1,iVar1);
    }
    else {
      for (iLit = 0; iVar1 = Vec_IntSize(vSupp), iLit < iVar1; iLit = iLit + 1) {
        iVar1 = Vec_IntEntry(vSupp,iLit);
        pGVar3 = Gia_ManCi(pNew,iLit);
        uVar2 = Gia_Obj2Lit(pNew,pGVar3);
        pGVar3 = Gia_ManCi(p,iVar1);
        pGVar3->Value = uVar2;
      }
      pGVar3 = Gia_ObjFanin0(pObj);
      Gia_ManDupHashDfs_rec(pNew,p,pGVar3);
      pNew_local._4_4_ = Gia_ObjFanin0Copy(pObj);
      pGVar3 = Gia_ObjFanin0(pObj);
      Gia_ManDupCleanDfs_rec(pGVar3);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Gia_ManIsoStrashReduceOne( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    int k, iCi, iLit;
    assert( Gia_ObjIsCo(pObj) );
    if ( Vec_IntSize(vSupp) == 0 )
        return Abc_Var2Lit(0, Gia_ObjFaninC0(pObj));
    if ( Vec_IntSize(vSupp) == 1 )
        return Abc_Var2Lit(1, Gia_ObjFaninC0(pObj));
    Vec_IntForEachEntry( vSupp, iCi, k )
        Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
    Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    iLit = Gia_ObjFanin0Copy(pObj);
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
    return iLit;
}